

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levinson_durbin_recursion.cc
# Opt level: O0

bool __thiscall
sptk::LevinsonDurbinRecursion::Run
          (LevinsonDurbinRecursion *this,vector<double,_std::allocator<double>_> *autocorrelation,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,bool *is_stable,
          Buffer *buffer)

{
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  int iVar6;
  undefined1 *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  long in_R8;
  double dVar7;
  double dVar8;
  int j_2;
  int j_1;
  int j;
  double k;
  int i;
  double e;
  double *c;
  double *a;
  double *r;
  int length;
  int local_74;
  int local_70;
  int local_6c;
  double local_68;
  int local_5c;
  size_type in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  bool local_1;
  
  iVar6 = *(int *)(in_RDI + 8) + 1;
  if (((((*(byte *)(in_RDI + 0xc) & 1) == 0) ||
       (sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI), sVar2 != (long)iVar6))
      || (in_RDX == (vector<double,_std::allocator<double>_> *)0x0)) ||
     ((in_RCX == (undefined1 *)0x0 || (in_R8 == 0)))) {
    local_1 = false;
  }
  else {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar2 != (long)iVar6) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R8 + 8));
    if (sVar2 != (long)iVar6) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    *in_RCX = 1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_R8 + 8),0);
    *pvVar4 = 0.0;
    dVar8 = *pvVar3;
    if (((dVar8 == 0.0) && (!NAN(dVar8))) || (uVar1 = std::isnan(dVar8), (uVar1 & 1) != 0)) {
      local_1 = false;
    }
    else {
      for (local_5c = 1; local_5c < iVar6; local_5c = local_5c + 1) {
        local_68 = -pvVar3[local_5c];
        for (local_6c = 1; local_6c < local_5c; local_6c = local_6c + 1) {
          local_68 = -pvVar5[local_6c] * pvVar3[local_5c - local_6c] + local_68;
        }
        dVar7 = local_68 / dVar8;
        if (1.0 <= ABS(dVar7)) {
          *in_RCX = 0;
        }
        for (local_70 = 1; local_70 < local_5c; local_70 = local_70 + 1) {
          pvVar4[local_70] = dVar7 * pvVar5[local_5c - local_70] + pvVar5[local_70];
        }
        pvVar4[local_5c] = dVar7;
        dVar8 = (-dVar7 * dVar7 + 1.0) * dVar8;
        if (((dVar8 == 0.0) && (!NAN(dVar8))) || (uVar1 = std::isnan(dVar8), (uVar1 & 1) != 0)) {
          return false;
        }
        for (local_74 = 0; local_74 <= local_5c; local_74 = local_74 + 1) {
          pvVar5[local_74] = pvVar4[local_74];
        }
      }
      dVar8 = sqrt(dVar8);
      *pvVar4 = dVar8;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool LevinsonDurbinRecursion::Run(
    const std::vector<double>& autocorrelation,
    std::vector<double>* linear_predictive_coefficients, bool* is_stable,
    LevinsonDurbinRecursion::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      autocorrelation.size() != static_cast<std::size_t>(length) ||
      NULL == linear_predictive_coefficients || NULL == is_stable ||
      NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (linear_predictive_coefficients->size() !=
      static_cast<std::size_t>(length)) {
    linear_predictive_coefficients->resize(length);
  }
  if (buffer->c_.size() != static_cast<std::size_t>(length)) {
    buffer->c_.resize(length);
  }

  *is_stable = true;

  const double* r(&(autocorrelation[0]));
  double* a(&((*linear_predictive_coefficients)[0]));
  double* c(&buffer->c_[0]);

  // Set initial condition.
  a[0] = 0.0;
  double e(r[0]);
  if (0.0 == e || std::isnan(e)) {
    return false;
  }

  // Perform Durbin's iterative algorithm.
  for (int i(1); i < length; ++i) {
    double k(-r[i]);
    for (int j(1); j < i; ++j) {
      k -= c[j] * r[i - j];
    }
    k /= e;

    if (1.0 <= std::fabs(k)) {
      *is_stable = false;
    }

    for (int j(1); j < i; ++j) {
      a[j] = c[j] + k * c[i - j];
    }
    a[i] = k;

    e *= 1.0 - k * k;
    if (0.0 == e || std::isnan(e)) {
      return false;
    }

    for (int j(0); j <= i; ++j) {
      c[j] = a[j];
    }
  }

  // Set gain.
  a[0] = std::sqrt(e);

  return true;
}